

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psac.cpp
# Opt level: O0

void __thiscall PSAC_RepeatsAll_Test::~PSAC_RepeatsAll_Test(PSAC_RepeatsAll_Test *this)

{
  PSAC_RepeatsAll_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(PSAC, RepeatsAll) {
    mxx::comm c;

    // create stirng with many repeats
    std::string str;
    if (c.rank() == 0) {
        std::vector<std::string> strings = {"helloworld", "blahlablah", "ellow", "worldblah", "rld", "hello" };
        // generate some random input string
        size_t numstr = 15000;
        std::stringstream ss;
        for (size_t i = 0; i < numstr; ++i) {
            ss << strings[std::rand() % strings.size()];
        }
        str = ss.str();
    }
    // distribute string equally
    std::string local_str = mxx::stable_distribute(str, c);

    // create suffix array w/o LCP
    suffix_array<std::string::iterator, uint64_t, false> sa(local_str.begin(), local_str.end(), c);

    // construct suffix array
    sa.construct();
    ASSERT_TRUE(check_sa_dss(sa, str, c));
    ASSERT_TRUE(check_sa_eqdss(sa, str, c));

    // construct with custom `k` to force early bucket chaising
    sa.construct(true, 3);
    ASSERT_TRUE(check_sa_dss(sa, str, c));
    ASSERT_TRUE(check_sa_eqdss(sa, str, c));

    // construct without bucket chaising
    sa.construct(false, 2);
    ASSERT_TRUE(check_sa_dss(sa, str, c));

    // construct with std::array based construction
    sa.construct_arr<2>(true);
    ASSERT_TRUE(check_sa_dss(sa, str, c));

    // construct with prefix-tripling
    sa.construct_arr<3>(true);
    ASSERT_TRUE(check_sa_dss(sa, str, c));

    // construct with prefix-quadrupling
    sa.construct_arr<3>(false);
    ASSERT_TRUE(check_sa_dss(sa, str, c));
}